

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O0

void __thiscall State::Dump(State *this)

{
  bool bVar1;
  uint uVar2;
  pointer ppVar3;
  undefined8 uVar4;
  pointer ppVar5;
  ulong uVar6;
  char *local_68;
  char *local_60;
  iterator local_48;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>
  local_40;
  iterator local_38;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>
  local_30;
  const_iterator it;
  Node *node;
  _Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true> local_18;
  iterator i;
  State *this_local;
  
  i.super__Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true>)
       (_Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true>)this;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<StringPiece,_Node_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>_>
       ::begin(&this->paths_);
  while( true ) {
    node = (Node *)std::
                   unordered_map<StringPiece,_Node_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>_>
                   ::end(&this->paths_);
    bVar1 = std::__detail::operator!=
                      (&local_18,
                       (_Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true> *)&node);
    if (!bVar1) break;
    ppVar3 = std::__detail::_Node_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true>::
             operator->((_Node_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true> *)
                        &local_18);
    it._M_node = (_Base_ptr)ppVar3->second;
    Node::path_abi_cxx11_((Node *)it._M_node);
    uVar4 = std::__cxx11::string::c_str();
    bVar1 = Node::status_known((Node *)it._M_node);
    if (bVar1) {
      bVar1 = Node::dirty((Node *)it._M_node);
      if (bVar1) {
        local_60 = "dirty";
      }
      else {
        local_60 = "clean";
      }
      local_68 = local_60;
    }
    else {
      local_68 = "unknown";
    }
    uVar2 = Node::id((Node *)it._M_node);
    printf("%s %s [id:%d]\n",uVar4,local_68,(ulong)uVar2);
    std::__detail::_Node_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true>::operator++
              ((_Node_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true> *)&local_18);
  }
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
          ::empty(&this->pools_);
  if (!bVar1) {
    printf("resource_pools:\n");
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
         ::begin(&this->pools_);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>
    ::_Rb_tree_const_iterator(&local_30,&local_38);
    while( true ) {
      local_48._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
           ::end(&this->pools_);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>
      ::_Rb_tree_const_iterator(&local_40,&local_48);
      bVar1 = std::operator!=(&local_30,&local_40);
      if (!bVar1) break;
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>
               ::operator->(&local_30);
      Pool::name_abi_cxx11_(ppVar5->second);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        ppVar5 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>
                 ::operator->(&local_30);
        Pool::Dump(ppVar5->second);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>
      ::operator++(&local_30);
    }
  }
  return;
}

Assistant:

void State::Dump() {
  for (Paths::iterator i = paths_.begin(); i != paths_.end(); ++i) {
    Node* node = i->second;
    printf("%s %s [id:%d]\n",
           node->path().c_str(),
           node->status_known() ? (node->dirty() ? "dirty" : "clean")
                                : "unknown",
           node->id());
  }
  if (!pools_.empty()) {
    printf("resource_pools:\n");
    for (map<string, Pool*>::const_iterator it = pools_.begin();
         it != pools_.end(); ++it)
    {
      if (!it->second->name().empty()) {
        it->second->Dump();
      }
    }
  }
}